

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GetScalarFieldOfTable
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string getter;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  getter.field_2._8_8_ = code_ptr;
  GenGetter_abi_cxx11_((string *)local_50,this,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  IdlNamer::Function_abi_cxx11_(&local_a0,&this->namer_,&field->super_Definition);
  std::operator+(&local_80," ",&local_a0);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  TypeName_abi_cxx11_(&local_100,this,field);
  std::operator+(&local_e0,"() ",&local_100);
  std::operator+(&local_c0,&local_e0," ");
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  OffsetPrefix_abi_cxx11_(&local_120,this,field);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,"\t\tv := ");
  }
  else {
    std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,"\t\treturn ");
  }
  std::operator+(&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "(o + rcv._tab.Pos)");
  CastToEnum(&local_140,this,&(field->value).type,&local_160);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,"\n\t\treturn &v");
  }
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,"\n\t}\n");
  GenConstant_abi_cxx11_(&local_1c0,this,field);
  std::operator+(&local_1a0,"\treturn ",&local_1c0);
  std::operator+(&local_180,&local_1a0,"\n");
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::operator+=((string *)getter.field_2._8_8_,"}\n\n");
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void GetScalarFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_ptr) {
    std::string &code = *code_ptr;
    std::string getter = GenGetter(field.value.type);
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "() " + TypeName(field) + " ";
    code += OffsetPrefix(field);
    if (field.IsScalarOptional()) {
      code += "\t\tv := ";
    } else {
      code += "\t\treturn ";
    }
    code += CastToEnum(field.value.type, getter + "(o + rcv._tab.Pos)");
    if (field.IsScalarOptional()) { code += "\n\t\treturn &v"; }
    code += "\n\t}\n";
    code += "\treturn " + GenConstant(field) + "\n";
    code += "}\n\n";
  }